

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_symbol.cpp
# Opt level: O1

int DSDcc::DSDSymbol::compShort(void *a,void *b)

{
  short sVar1;
  short sVar2;
  int iVar3;
  
  sVar1 = *a;
  sVar2 = *b;
  iVar3 = ((sVar2 <= sVar1) - 1) + (uint)(sVar2 <= sVar1);
  if (sVar1 == sVar2) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int DSDSymbol::compShort(const void *a, const void *b)
{
    if (*((const short *) a) == *((const short *) b))
        return 0;
    else if (*((const short *) a) < *((const short *) b))
        return -1;
    else
        return 1;
}